

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O3

void opengv::relative_pose::modules::fivept_kneip::sPolynomial33
               (Matrix<double,_66,_197,_0,_66,_197> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
          m_storage.m_data.array[3];
  dVar2 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
          m_storage.m_data.array[4];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[99] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x45] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x46] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xa5] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x87] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x88] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xe7] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xc9] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xca] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x129] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x10b] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x10c] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x16b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x14d] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x14e] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1ad] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[399] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[400] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x231] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x213] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x214] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2b5] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x297] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x298] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2f7] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2d9] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2da] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x339] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x31b] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x31c] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x37b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x35d] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x35e] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x3bd] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x39f] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3a0] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x3ff] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3e1] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3e2] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x441] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x423] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x424] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x4c5] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x4a7] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x4a8] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x507] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x4e9] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x4ea] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x549] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x52b] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x52c] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x58b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x56d] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x56e] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x5cd] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x5af] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x5b0] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x60f] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x5f1] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x5f2] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x693] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x675] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x676] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x6d5] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x6b7] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x6b8] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x717] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x6f9] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x6fa] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x759] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x73b] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x73c] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x79b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x77d] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x77e] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x7dd] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x7bf] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x7c0] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x8a3] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x885] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x886] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x8e5] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x8c7] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x8c8] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xa2f] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xa11] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xa12] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xa71] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xa53] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xa54] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xab3] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xa95] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xa96] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xaf5] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xad7] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xad8] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xb37] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xb19] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xb1a] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xb79] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xb5b] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xb5c] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xbbb] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xb9d] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xb9e] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xbfd] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xbdf] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xbe0] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xc3f] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xc21] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xc22] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xc81] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xc63] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xc64] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xcc3] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xca5] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xca6] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xd05] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xce7] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xce8] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xd47] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xd29] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xd2a] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xd89] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xd6b] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xd6c] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xdcb] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xdad] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xdae] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xe0d] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xdef] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xdf0] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xe4f] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xe31] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xe32] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xe91] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xe73] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xe74] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xed3] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xeb5] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xeb6] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xf15] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xef7] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xef8] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xf57] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xf39] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xf3a] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xf99] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xf7b] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xf7c] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xfdb] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xfbd] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xfbe] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x101d] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0xfff] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1000] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x10a1] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1083] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1084] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x10e3] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x10c5] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x10c6] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1125] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1107] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1108] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1167] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1149] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x114a] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x11a9] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x118b] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x118c] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x11eb] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x11cd] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x11ce] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x122d] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x120f] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1210] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x126f] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1251] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1252] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x12f3] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x12d5] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x12d6] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1335] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1317] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1318] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x13b9] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x139b] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x139c] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x13fb] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x13dd] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x13de] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x143d] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x141f] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1420] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x147f] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1461] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1462] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x14c1] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x14a3] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x14a4] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1503] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x14e5] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x14e6] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1545] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1527] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1528] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1587] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1569] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x156a] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x15c9] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x15ab] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x15ac] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x160b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x15ed] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x15ee] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x164d] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x162f] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1630] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x168f] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1671] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1672] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1713] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x16f5] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x16f6] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1797] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1779] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x177a] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x17d9] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x17bb] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x17bc] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x185d] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x183f] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1840] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1923] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1905] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1906] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1965] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1947] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1948] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x19a7] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1989] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x198a] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x19e9] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x19cb] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x19cc] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1a2b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1a0d] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1a0e] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1aaf] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1a91] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1a92] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1af1] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1ad3] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1ad4] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1b33] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1b15] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1b16] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1b75] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[6999] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[7000] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1bb7] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1b99] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1b9a] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1bf9] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1bdb] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1bdc] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1c3b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1c1d] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1c1e] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1c7d] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1c5f] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1c60] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1cbf] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1ca1] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1ca2] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1d01] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1ce3] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1ce4] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1d43] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1d25] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1d26] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1dc7] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1da9] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1daa] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1e09] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1deb] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1dec] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1e8d] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1e6f] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1e70] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1ecf] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1eb1] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1eb2] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1f11] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1ef3] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1ef4] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1f53] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1f35] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1f36] / dVar2;
  dVar1 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
          m_storage.m_data.array[3];
  dVar2 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
          m_storage.m_data.array[4];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1f95] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1f77] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1f78] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1fd7] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1fb9] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x1fba] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x205b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x203d] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x203e] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x209d] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x207f] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2080] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x20df] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x20c1] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x20c2] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2121] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2103] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2104] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2163] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2145] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2146] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x21a5] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2187] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2188] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x226b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x224d] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x224e] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x22ad] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x228f] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2290] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2331] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2313] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2314] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2373] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2355] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2356] / dVar2;
  return;
}

Assistant:

void
opengv::relative_pose::modules::fivept_kneip::sPolynomial33( Eigen::Matrix<double,66,197> & groebnerMatrix )
{
  groebnerMatrix(33,1) = (groebnerMatrix(3,1)/(groebnerMatrix(3,0))-groebnerMatrix(4,1)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,2) = (groebnerMatrix(3,2)/(groebnerMatrix(3,0))-groebnerMatrix(4,2)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,3) = (groebnerMatrix(3,3)/(groebnerMatrix(3,0))-groebnerMatrix(4,3)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,4) = (groebnerMatrix(3,4)/(groebnerMatrix(3,0))-groebnerMatrix(4,4)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,5) = (groebnerMatrix(3,5)/(groebnerMatrix(3,0))-groebnerMatrix(4,5)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,6) = (groebnerMatrix(3,6)/(groebnerMatrix(3,0))-groebnerMatrix(4,6)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,8) = (groebnerMatrix(3,8)/(groebnerMatrix(3,0))-groebnerMatrix(4,8)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,10) = (groebnerMatrix(3,10)/(groebnerMatrix(3,0))-groebnerMatrix(4,10)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,11) = (groebnerMatrix(3,11)/(groebnerMatrix(3,0))-groebnerMatrix(4,11)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,12) = (groebnerMatrix(3,12)/(groebnerMatrix(3,0))-groebnerMatrix(4,12)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,13) = (groebnerMatrix(3,13)/(groebnerMatrix(3,0))-groebnerMatrix(4,13)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,14) = (groebnerMatrix(3,14)/(groebnerMatrix(3,0))-groebnerMatrix(4,14)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,15) = (groebnerMatrix(3,15)/(groebnerMatrix(3,0))-groebnerMatrix(4,15)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,16) = (groebnerMatrix(3,16)/(groebnerMatrix(3,0))-groebnerMatrix(4,16)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,18) = (groebnerMatrix(3,18)/(groebnerMatrix(3,0))-groebnerMatrix(4,18)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,19) = (groebnerMatrix(3,19)/(groebnerMatrix(3,0))-groebnerMatrix(4,19)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,20) = (groebnerMatrix(3,20)/(groebnerMatrix(3,0))-groebnerMatrix(4,20)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,21) = (groebnerMatrix(3,21)/(groebnerMatrix(3,0))-groebnerMatrix(4,21)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,22) = (groebnerMatrix(3,22)/(groebnerMatrix(3,0))-groebnerMatrix(4,22)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,23) = (groebnerMatrix(3,23)/(groebnerMatrix(3,0))-groebnerMatrix(4,23)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,25) = (groebnerMatrix(3,25)/(groebnerMatrix(3,0))-groebnerMatrix(4,25)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,26) = (groebnerMatrix(3,26)/(groebnerMatrix(3,0))-groebnerMatrix(4,26)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,27) = (groebnerMatrix(3,27)/(groebnerMatrix(3,0))-groebnerMatrix(4,27)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,28) = (groebnerMatrix(3,28)/(groebnerMatrix(3,0))-groebnerMatrix(4,28)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,29) = (groebnerMatrix(3,29)/(groebnerMatrix(3,0))-groebnerMatrix(4,29)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,30) = (groebnerMatrix(3,30)/(groebnerMatrix(3,0))-groebnerMatrix(4,30)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,33) = (groebnerMatrix(3,33)/(groebnerMatrix(3,0))-groebnerMatrix(4,33)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,34) = (groebnerMatrix(3,34)/(groebnerMatrix(3,0))-groebnerMatrix(4,34)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,39) = (groebnerMatrix(3,39)/(groebnerMatrix(3,0))-groebnerMatrix(4,39)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,40) = (groebnerMatrix(3,40)/(groebnerMatrix(3,0))-groebnerMatrix(4,40)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,41) = (groebnerMatrix(3,41)/(groebnerMatrix(3,0))-groebnerMatrix(4,41)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,42) = (groebnerMatrix(3,42)/(groebnerMatrix(3,0))-groebnerMatrix(4,42)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,43) = (groebnerMatrix(3,43)/(groebnerMatrix(3,0))-groebnerMatrix(4,43)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,44) = (groebnerMatrix(3,44)/(groebnerMatrix(3,0))-groebnerMatrix(4,44)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,45) = (groebnerMatrix(3,45)/(groebnerMatrix(3,0))-groebnerMatrix(4,45)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,46) = (groebnerMatrix(3,46)/(groebnerMatrix(3,0))-groebnerMatrix(4,46)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,47) = (groebnerMatrix(3,47)/(groebnerMatrix(3,0))-groebnerMatrix(4,47)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,48) = (groebnerMatrix(3,48)/(groebnerMatrix(3,0))-groebnerMatrix(4,48)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,49) = (groebnerMatrix(3,49)/(groebnerMatrix(3,0))-groebnerMatrix(4,49)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,50) = (groebnerMatrix(3,50)/(groebnerMatrix(3,0))-groebnerMatrix(4,50)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,51) = (groebnerMatrix(3,51)/(groebnerMatrix(3,0))-groebnerMatrix(4,51)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,52) = (groebnerMatrix(3,52)/(groebnerMatrix(3,0))-groebnerMatrix(4,52)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,53) = (groebnerMatrix(3,53)/(groebnerMatrix(3,0))-groebnerMatrix(4,53)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,54) = (groebnerMatrix(3,54)/(groebnerMatrix(3,0))-groebnerMatrix(4,54)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,55) = (groebnerMatrix(3,55)/(groebnerMatrix(3,0))-groebnerMatrix(4,55)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,56) = (groebnerMatrix(3,56)/(groebnerMatrix(3,0))-groebnerMatrix(4,56)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,57) = (groebnerMatrix(3,57)/(groebnerMatrix(3,0))-groebnerMatrix(4,57)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,58) = (groebnerMatrix(3,58)/(groebnerMatrix(3,0))-groebnerMatrix(4,58)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,59) = (groebnerMatrix(3,59)/(groebnerMatrix(3,0))-groebnerMatrix(4,59)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,60) = (groebnerMatrix(3,60)/(groebnerMatrix(3,0))-groebnerMatrix(4,60)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,61) = (groebnerMatrix(3,61)/(groebnerMatrix(3,0))-groebnerMatrix(4,61)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,62) = (groebnerMatrix(3,62)/(groebnerMatrix(3,0))-groebnerMatrix(4,62)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,64) = (groebnerMatrix(3,64)/(groebnerMatrix(3,0))-groebnerMatrix(4,64)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,65) = (groebnerMatrix(3,65)/(groebnerMatrix(3,0))-groebnerMatrix(4,65)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,66) = (groebnerMatrix(3,66)/(groebnerMatrix(3,0))-groebnerMatrix(4,66)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,67) = (groebnerMatrix(3,67)/(groebnerMatrix(3,0))-groebnerMatrix(4,67)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,68) = (groebnerMatrix(3,68)/(groebnerMatrix(3,0))-groebnerMatrix(4,68)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,69) = (groebnerMatrix(3,69)/(groebnerMatrix(3,0))-groebnerMatrix(4,69)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,70) = (groebnerMatrix(3,70)/(groebnerMatrix(3,0))-groebnerMatrix(4,70)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,71) = (groebnerMatrix(3,71)/(groebnerMatrix(3,0))-groebnerMatrix(4,71)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,73) = (groebnerMatrix(3,73)/(groebnerMatrix(3,0))-groebnerMatrix(4,73)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,74) = (groebnerMatrix(3,74)/(groebnerMatrix(3,0))-groebnerMatrix(4,74)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,76) = (groebnerMatrix(3,76)/(groebnerMatrix(3,0))-groebnerMatrix(4,76)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,77) = (groebnerMatrix(3,77)/(groebnerMatrix(3,0))-groebnerMatrix(4,77)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,78) = (groebnerMatrix(3,78)/(groebnerMatrix(3,0))-groebnerMatrix(4,78)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,79) = (groebnerMatrix(3,79)/(groebnerMatrix(3,0))-groebnerMatrix(4,79)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,80) = (groebnerMatrix(3,80)/(groebnerMatrix(3,0))-groebnerMatrix(4,80)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,81) = (groebnerMatrix(3,81)/(groebnerMatrix(3,0))-groebnerMatrix(4,81)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,82) = (groebnerMatrix(3,82)/(groebnerMatrix(3,0))-groebnerMatrix(4,82)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,83) = (groebnerMatrix(3,83)/(groebnerMatrix(3,0))-groebnerMatrix(4,83)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,84) = (groebnerMatrix(3,84)/(groebnerMatrix(3,0))-groebnerMatrix(4,84)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,85) = (groebnerMatrix(3,85)/(groebnerMatrix(3,0))-groebnerMatrix(4,85)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,86) = (groebnerMatrix(3,86)/(groebnerMatrix(3,0))-groebnerMatrix(4,86)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,87) = (groebnerMatrix(3,87)/(groebnerMatrix(3,0))-groebnerMatrix(4,87)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,89) = (groebnerMatrix(3,89)/(groebnerMatrix(3,0))-groebnerMatrix(4,89)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,91) = (groebnerMatrix(3,91)/(groebnerMatrix(3,0))-groebnerMatrix(4,91)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,92) = (groebnerMatrix(3,92)/(groebnerMatrix(3,0))-groebnerMatrix(4,92)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,94) = (groebnerMatrix(3,94)/(groebnerMatrix(3,0))-groebnerMatrix(4,94)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,97) = (groebnerMatrix(3,97)/(groebnerMatrix(3,0))-groebnerMatrix(4,97)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,98) = (groebnerMatrix(3,98)/(groebnerMatrix(3,0))-groebnerMatrix(4,98)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,99) = (groebnerMatrix(3,99)/(groebnerMatrix(3,0))-groebnerMatrix(4,99)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,100) = (groebnerMatrix(3,100)/(groebnerMatrix(3,0))-groebnerMatrix(4,100)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,101) = (groebnerMatrix(3,101)/(groebnerMatrix(3,0))-groebnerMatrix(4,101)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,103) = (groebnerMatrix(3,103)/(groebnerMatrix(3,0))-groebnerMatrix(4,103)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,104) = (groebnerMatrix(3,104)/(groebnerMatrix(3,0))-groebnerMatrix(4,104)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,105) = (groebnerMatrix(3,105)/(groebnerMatrix(3,0))-groebnerMatrix(4,105)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,106) = (groebnerMatrix(3,106)/(groebnerMatrix(3,0))-groebnerMatrix(4,106)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,107) = (groebnerMatrix(3,107)/(groebnerMatrix(3,0))-groebnerMatrix(4,107)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,108) = (groebnerMatrix(3,108)/(groebnerMatrix(3,0))-groebnerMatrix(4,108)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,109) = (groebnerMatrix(3,109)/(groebnerMatrix(3,0))-groebnerMatrix(4,109)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,110) = (groebnerMatrix(3,110)/(groebnerMatrix(3,0))-groebnerMatrix(4,110)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,111) = (groebnerMatrix(3,111)/(groebnerMatrix(3,0))-groebnerMatrix(4,111)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,112) = (groebnerMatrix(3,112)/(groebnerMatrix(3,0))-groebnerMatrix(4,112)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,113) = (groebnerMatrix(3,113)/(groebnerMatrix(3,0))-groebnerMatrix(4,113)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,115) = (groebnerMatrix(3,115)/(groebnerMatrix(3,0))-groebnerMatrix(4,115)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,116) = (groebnerMatrix(3,116)/(groebnerMatrix(3,0))-groebnerMatrix(4,116)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,118) = (groebnerMatrix(3,118)/(groebnerMatrix(3,0))-groebnerMatrix(4,118)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,119) = (groebnerMatrix(3,119)/(groebnerMatrix(3,0))-groebnerMatrix(4,119)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,120) = (groebnerMatrix(3,120)/(groebnerMatrix(3,0))-groebnerMatrix(4,120)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,121) = (groebnerMatrix(3,121)/(groebnerMatrix(3,0))-groebnerMatrix(4,121)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,122) = (groebnerMatrix(3,122)/(groebnerMatrix(3,0))-groebnerMatrix(4,122)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,123) = (groebnerMatrix(3,123)/(groebnerMatrix(3,0))-groebnerMatrix(4,123)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,125) = (groebnerMatrix(3,125)/(groebnerMatrix(3,0))-groebnerMatrix(4,125)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,126) = (groebnerMatrix(3,126)/(groebnerMatrix(3,0))-groebnerMatrix(4,126)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,127) = (groebnerMatrix(3,127)/(groebnerMatrix(3,0))-groebnerMatrix(4,127)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,128) = (groebnerMatrix(3,128)/(groebnerMatrix(3,0))-groebnerMatrix(4,128)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,129) = (groebnerMatrix(3,129)/(groebnerMatrix(3,0))-groebnerMatrix(4,129)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,130) = (groebnerMatrix(3,130)/(groebnerMatrix(3,0))-groebnerMatrix(4,130)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,133) = (groebnerMatrix(3,133)/(groebnerMatrix(3,0))-groebnerMatrix(4,133)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,134) = (groebnerMatrix(3,134)/(groebnerMatrix(3,0))-groebnerMatrix(4,134)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,136) = (groebnerMatrix(3,136)/(groebnerMatrix(3,0))-groebnerMatrix(4,136)/(groebnerMatrix(4,0)));
  groebnerMatrix(33,137) = (groebnerMatrix(3,137)/(groebnerMatrix(3,0))-groebnerMatrix(4,137)/(groebnerMatrix(4,0)));
}